

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringTest_MemoryUsageComparison_Test::TestBody
          (MicroStringTest_MemoryUsageComparison_Test *this)

{
  string_view value;
  string_view data;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_t size_max;
  int64_t this_diff;
  int64_t diff;
  Message local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar;
  int64_t this_arena_str_used;
  int64_t this_micro_str_used;
  size_t sStack_160;
  size_t local_158;
  size_t sStack_150;
  undefined1 auStack_148 [8];
  string_view this_input;
  size_t i;
  anon_class_24_3_b181217e print_range;
  int64_t arena_str_used;
  int64_t micro_str_used;
  size_t size_min;
  string local_f8 [8];
  string input;
  ArenaStringPtr arena_str;
  MicroString local_c0;
  MicroString micro_str;
  Arena arena;
  MicroStringTest_MemoryUsageComparison_Test *this_local;
  
  Arena::Arena((Arena *)&micro_str);
  MicroString::MicroString(&local_c0);
  ArenaStringPtr::InitDefault((ArenaStringPtr *)((long)&input.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,200,'x',(allocator<char> *)((long)&size_min + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&size_min + 7));
  micro_str_used = 0;
  arena_str_used = 0;
  print_range.size_min = (size_t *)0x0;
  i = (size_t)&arena_str_used;
  print_range.micro_str_used = (int64_t *)&print_range.size_min;
  print_range.arena_str_used = &micro_str_used;
  for (this_input._M_str = (char *)0x1; pcVar3 = this_input._M_str,
      pcVar2 = (char *)std::__cxx11::string::size(), pcVar3 < pcVar2;
      this_input._M_str = this_input._M_str + 1) {
    pcVar3 = (char *)std::__cxx11::string::data();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_148,pcVar3,
               (size_type)this_input._M_str);
    local_158 = (size_t)auStack_148;
    sStack_150 = this_input._M_len;
    data._M_str = (char *)this_input._M_len;
    data._M_len = (size_t)auStack_148;
    MicroString::Set(&local_c0,data,(Arena *)&micro_str);
    this_micro_str_used = (int64_t)auStack_148;
    sStack_160 = this_input._M_len;
    value._M_str = (char *)this_input._M_len;
    value._M_len = (size_t)auStack_148;
    ArenaStringPtr::Set((ArenaStringPtr *)((long)&input.field_2 + 8),value,(Arena *)&micro_str);
    this_arena_str_used = MicroString::SpaceUsedExcludingSelfLong(&local_c0);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )anon_unknown_0::SpaceUsedExcludingSelfLong((ArenaStringPtr *)((long)&input.field_2 + 8));
    testing::internal::CmpHelperLE<long,long>
              ((internal *)local_188,"this_micro_str_used","this_arena_str_used",
               &this_arena_str_used,(long *)&gtest_ar.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&diff,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                 ,0x427,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&diff,&local_190);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&diff);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    if (this_arena_str_used -
        (long)gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl != arena_str_used - (long)print_range.size_min) {
      TestBody::anon_class_24_3_b181217e::operator()
                ((anon_class_24_3_b181217e *)&i,(size_t)(this_input._M_str + -1));
      micro_str_used = (int64_t)this_input._M_str;
      arena_str_used = this_arena_str_used;
      print_range.size_min =
           (size_t *)
           gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
  }
  size_max = std::__cxx11::string::size();
  TestBody::anon_class_24_3_b181217e::operator()((anon_class_24_3_b181217e *)&i,size_max);
  std::__cxx11::string::~string(local_f8);
  Arena::~Arena((Arena *)&micro_str);
  return;
}

Assistant:

TEST(MicroStringTest, MemoryUsageComparison) {
  Arena arena;
  MicroString micro_str;
  ArenaStringPtr arena_str;
  arena_str.InitDefault();

  const std::string input(200, 'x');

  size_t size_min = 0;
  int64_t micro_str_used = 0;
  int64_t arena_str_used = 0;

  const auto print_range = [&](size_t size_max) {
    int64_t diff = micro_str_used - arena_str_used;
    absl::PrintF(
        "[%3d, %3d] MicroString-ArenaStringPtr=%3d (%s) MicroUsed=%3d "
        "ArenaStringPtrUsed=%3d\n",
        size_min, size_max, diff,
        diff == 0  ? "same "
        : diff < 0 ? "saves"
                   : "regrs",
        micro_str_used, arena_str_used);
  };
  for (size_t i = 1; i < input.size(); ++i) {
    absl::string_view this_input(input.data(), i);
    micro_str.Set(this_input, &arena);
    arena_str.Set(this_input, &arena);

    int64_t this_micro_str_used = micro_str.SpaceUsedExcludingSelfLong();
    int64_t this_arena_str_used = SpaceUsedExcludingSelfLong(arena_str);
    // We expect to always use the same or less memory.
    if (sizeof(void*) >= 8) {
      EXPECT_LE(this_micro_str_used, this_arena_str_used);
    } else {
      // Except that in 32-bit platforms we have heap alignment to 4 bytes, but
      // arena alignment is always 8. Take that fact into account by rounding up
      // the ArenaStringPtr use.
      EXPECT_LE(this_micro_str_used,
                ArenaAlignDefault::Ceil(this_arena_str_used));
    }

    int64_t diff = micro_str_used - arena_str_used;
    int64_t this_diff = this_micro_str_used - this_arena_str_used;

    if (this_diff != diff) {
      print_range(i - 1);
      size_min = i;
      micro_str_used = this_micro_str_used;
      arena_str_used = this_arena_str_used;
    }
  }
  print_range(input.size());
}